

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_stat(mg_connection *conn,char *path,mg_file_stat *filep)

{
  int iVar1;
  int iVar2;
  stat st;
  stat64 local_a0;
  
  iVar1 = 0;
  iVar2 = 0;
  if (path != (char *)0x0) {
    path[0x10] = '\0';
    path[0x11] = '\0';
    path[0x12] = '\0';
    path[0x13] = '\0';
    path[0x14] = '\0';
    path[0x15] = '\0';
    path[0x16] = '\0';
    path[0x17] = '\0';
    path[0x18] = '\0';
    path[0x19] = '\0';
    path[0x1a] = '\0';
    path[0x1b] = '\0';
    path[0x1c] = '\0';
    path[0x1d] = '\0';
    path[0x1e] = '\0';
    path[0x1f] = '\0';
    path[0] = '\0';
    path[1] = '\0';
    path[2] = '\0';
    path[3] = '\0';
    path[4] = '\0';
    path[5] = '\0';
    path[6] = '\0';
    path[7] = '\0';
    path[8] = '\0';
    path[9] = '\0';
    path[10] = '\0';
    path[0xb] = '\0';
    path[0xc] = '\0';
    path[0xd] = '\0';
    path[0xe] = '\0';
    path[0xf] = '\0';
    iVar2 = iVar1;
    if ((conn != (mg_connection *)0x0) && ((char)conn->connection_type != '\0')) {
      iVar1 = stat64((char *)conn,&local_a0);
      if (iVar1 == 0) {
        *(__off_t *)path = local_a0.st_size;
        *(__time_t *)(path + 8) = local_a0.st_mtim.tv_sec;
        *(uint *)(path + 0x10) = (uint)((local_a0.st_mode & 0xf000) == 0x4000);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
mg_stat(const struct mg_connection *conn,
        const char *path,
        struct mg_file_stat *filep)
{
	struct stat st;
	if (!filep) {
		return 0;
	}
	memset(filep, 0, sizeof(*filep));

	if (mg_path_suspicious(conn, path)) {
		return 0;
	}

	if (0 == stat(path, &st)) {
		filep->size = (uint64_t)(st.st_size);
		filep->last_modified = st.st_mtime;
		filep->is_directory = S_ISDIR(st.st_mode);
		return 1;
	}

	return 0;
}